

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node *
lyd_new_path(lyd_node *data_tree,ly_ctx *ctx,char *path,void *value,LYD_ANYDATA_VALUETYPE value_type
            ,int options)

{
  char cVar1;
  LYS_NODE LVar2;
  LYS_NODE LVar3;
  uint uVar4;
  int iVar5;
  lys_module *module;
  lys_node *plVar6;
  lys_module *plVar7;
  lys_node *plVar8;
  lyd_node *plVar9;
  char *pcVar10;
  undefined8 uVar11;
  char *val_str;
  LY_ECODE ecode;
  ly_ctx *plVar12;
  long lVar13;
  lyd_node *plVar14;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  lyd_node *plVar18;
  int iVar19;
  lys_node *node;
  char *local_d8;
  char *val_name;
  char *val;
  char *local_c0;
  int local_b8;
  int local_b4;
  int val_name_len;
  int val_len;
  lys_module *local_a8;
  char *local_a0;
  LYS_NODE local_98;
  uint local_94;
  char *local_90;
  lyd_node *local_88;
  int local_80;
  LYD_ANYDATA_VALUETYPE local_7c;
  int has_predicate;
  char *name;
  char *mod_name;
  char *local_60;
  lyd_node *local_58;
  uint local_4c;
  int local_48;
  int local_44;
  int mod_name_len;
  int nam_len;
  int local_38;
  int local_34;
  int parsed;
  int is_relative;
  
  local_38 = 0;
  local_34 = -1;
  if (((path == (char *)0x0) || (data_tree == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0)) ||
     ((data_tree == (lyd_node *)0x0 && (*path != '/')))) {
    pcVar16 = "Invalid arguments (%s()).";
    pcVar10 = "lyd_new_path";
    plVar12 = (ly_ctx *)0x0;
LAB_00168594:
    ly_log(plVar12,LY_LLERR,LY_EINVAL,pcVar16,pcVar10);
    return (lyd_node *)0x0;
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = data_tree->schema->module->ctx;
  }
  local_7c = value_type;
  _val_name_len = data_tree;
  local_90 = (char *)value;
  mod_name = path;
  _mod_name_len = ctx;
  if (data_tree == (lyd_node *)0x0) {
    plVar9 = (lyd_node *)0x0;
  }
  else {
    if (*path == '/') {
      pcVar10 = (char *)0x0;
      if (value_type < LYD_ANYDATA_JSON) {
        pcVar10 = (char *)value;
      }
      do {
        plVar9 = resolve_partial_json_data_nodeid(mod_name,pcVar10,data_tree,options,&local_38);
        if (local_38 != 0) break;
        data_tree = data_tree->next;
      } while (data_tree != (lyd_node *)0x0);
      if (local_38 == 0) {
        pcVar10 = (char *)0x0;
        if (local_7c < LYD_ANYDATA_JSON) {
          pcVar10 = local_90;
        }
        plVar14 = _val_name_len->prev;
        if (plVar14->next != (lyd_node *)0x0) {
          do {
            plVar9 = resolve_partial_json_data_nodeid(mod_name,pcVar10,plVar14,options,&local_38);
            if (local_38 != 0) break;
            plVar14 = plVar14->prev;
          } while (plVar14->next != (lyd_node *)0x0);
        }
      }
    }
    else {
      pcVar10 = (char *)0x0;
      if (value_type < LYD_ANYDATA_JSON) {
        pcVar10 = (char *)value;
      }
      plVar9 = resolve_partial_json_data_nodeid(path,pcVar10,data_tree,options,&local_38);
    }
    lVar13 = (long)local_38;
    if (lVar13 == -1) {
      return (lyd_node *)0x0;
    }
    path = mod_name;
    if (local_38 != 0) {
      if (plVar9 == (lyd_node *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x778,
                      "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                     );
      }
      local_34 = 1;
      if (mod_name[lVar13] == '\0') {
        if (((options & 1U) == 0) && (((options & 8U) != 0 || ((plVar9->field_0x9 & 1) == 0)))) {
          ly_vlog(_mod_name_len,LYE_PATH_EXISTS,LY_VLOG_STR,mod_name);
          return (lyd_node *)0x0;
        }
        if (((options & 8U) != 0) && ((plVar9->field_0x9 & 1) != 0)) {
          return (lyd_node *)0x0;
        }
        plVar9 = lyd_new_path_update(plVar9,local_90,local_7c,options & 8U);
        return plVar9;
      }
      path = mod_name + lVar13;
    }
  }
  iVar5 = local_34;
  plVar12 = _mod_name_len;
  uVar4 = parse_schema_nodeid(path,&name,&local_48,(char **)&has_predicate,&local_44,&local_34,
                              (int *)0x0,(int *)0x0,1);
  if ((int)uVar4 < 1) {
    _has_predicate = path + -uVar4;
    cVar1 = path[-uVar4];
  }
  else {
    if (*_has_predicate == '#') {
      if (local_34 != 0) {
        uVar15 = 0x23;
        goto LAB_00168cef;
      }
      pcVar16 = _has_predicate + 1;
      local_a8 = (lys_module *)CONCAT44(local_a8._4_4_,local_44 + -1);
      path = path + uVar4;
      pcVar10 = name;
      iVar19 = local_48;
    }
    else {
      pcVar10 = (char *)0x0;
      pcVar16 = (char *)0x0;
      iVar19 = options;
      local_34 = iVar5;
    }
    local_4c = options;
    uVar4 = parse_schema_nodeid(path,&name,&local_48,(char **)&has_predicate,&local_44,&local_34,
                                &local_80,(int *)0x0,0);
    plVar12 = _mod_name_len;
    if (0 < (int)uVar4) {
      if (pcVar10 != (char *)0x0) {
        name = pcVar10;
        local_48 = iVar19;
      }
      local_60 = path;
      if (local_34 != 0) {
        if (_val_name_len == (lyd_node *)0x0) {
          pcVar16 = "%s: provided relative path (%s) without context node.";
          pcVar10 = mod_name;
          goto LAB_00168594;
        }
        if (plVar9 == (lyd_node *)0x0) {
          plVar9 = _val_name_len;
        }
        plVar8 = plVar9->schema;
        module = lys_node_module(plVar8);
        goto LAB_0016879c;
      }
      if (plVar9 != (lyd_node *)0x0) {
        __assert_fail("!parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x7bd,
                      "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                     );
      }
      if (name == (char *)0x0) {
        pcVar10 = strndup(mod_name,(size_t)(_has_predicate + ((long)local_44 - (long)mod_name)));
        ecode = LYE_PATH_MISSMOD;
      }
      else {
        module = ly_ctx_nget_module(_mod_name_len,name,(long)local_48,(char *)0x0,1);
        if (module != (lys_module *)0x0) {
          name = (char *)0x0;
          local_48 = 0;
          if (pcVar16 == (char *)0x0) {
            plVar9 = (lyd_node *)0x0;
            plVar8 = (lys_node *)0x0;
          }
          else {
            iVar5 = (int)local_a8;
            plVar8 = lyp_get_yang_data_template(module,pcVar16,(int)local_a8);
            if (plVar8 == (lys_node *)0x0) {
              pcVar10 = strndup(mod_name,(size_t)(pcVar16 + ((long)iVar5 - (long)mod_name)));
              ecode = LYE_PATH_INNODE;
              plVar12 = _mod_name_len;
              goto LAB_00168f3a;
            }
            plVar9 = (lyd_node *)0x0;
          }
LAB_0016879c:
          plVar6 = lys_getnext((lys_node *)0x0,plVar8,module,0);
          plVar14 = (lyd_node *)0x0;
          if (plVar6 != (lys_node *)0x0) {
            local_60 = local_60 + uVar4;
            local_94 = local_4c >> 3 & 1;
            local_98 = (local_4c & 4) * 0x80 + LYS_INPUT;
            local_a0 = (char *)0x0;
            local_a8 = module;
            plVar14 = (lyd_node *)0x0;
            do {
              while (local_58 = plVar14, local_88 = plVar9, node = plVar6, pcVar10 = name,
                    (node->nodetype & 0xc1bd) == LYS_UNKNOWN) {
LAB_00168879:
                plVar6 = lys_getnext(node,plVar8,module,0);
                plVar14 = local_58;
                plVar9 = local_88;
                if (plVar6 == (lys_node *)0x0) goto LAB_00168e3b;
              }
              plVar7 = lys_node_module(node);
              if (pcVar10 == (char *)0x0) {
                if (plVar7 == local_a8) goto LAB_00168857;
                goto LAB_00168879;
              }
              pcVar10 = plVar7->name;
              sVar17 = (size_t)local_48;
              iVar5 = strncmp(pcVar10,name,sVar17);
              if ((iVar5 != 0) || (pcVar10[sVar17] != '\0')) goto LAB_00168879;
LAB_00168857:
              pcVar10 = node->name;
              sVar17 = (size_t)local_44;
              iVar5 = strncmp(pcVar10,_has_predicate,sVar17);
              if ((iVar5 != 0) || (plVar6 = node, pcVar10[sVar17] != '\0')) goto LAB_00168879;
              do {
                plVar6 = lys_parent(plVar6);
                LVar3 = local_98;
                if (plVar6 == (lys_node *)0x0) goto LAB_001688d2;
                LVar2 = plVar6->nodetype;
              } while (LVar2 == LYS_USES);
              if ((local_4c & 4) != 0) {
                if (LVar2 != LYS_INPUT) goto LAB_001688d2;
                goto LAB_00168879;
              }
              if (LVar2 == LYS_OUTPUT) goto LAB_00168879;
LAB_001688d2:
              LVar2 = node->nodetype;
              if ((int)LVar2 < 0x20) {
                if ((int)LVar2 < 8) {
                  if (LVar2 != LYS_CONTAINER) {
                    if (LVar2 != LYS_LEAF) goto LAB_00168975;
                    goto LAB_001689a2;
                  }
                  goto LAB_00168937;
                }
                if (LVar2 != LYS_LEAFLIST) {
                  if (LVar2 != LYS_LIST) {
LAB_00168975:
                    ly_log(_mod_name_len,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                           ,0x854);
                    plVar9 = (lyd_node *)0x0;
                    goto LAB_00168af5;
                  }
                  goto LAB_00168937;
                }
LAB_001689a2:
                if (local_80 != 0) {
                  uVar4 = parse_schema_json_predicate
                                    (local_60,(char **)0x0,(int *)0x0,&local_d8,&local_b8,&val_name,
                                     &local_b4,&local_80);
                  if ((int)uVar4 < 1) {
                    pcVar10 = local_60 + -uVar4;
                    uVar15 = (ulong)(uint)(int)local_60[-uVar4];
                  }
                  else {
                    uVar15 = (ulong)(uint)(int)*local_d8;
                    pcVar10 = local_d8;
                    if (((int)*local_d8 == 0x2e) && (local_b8 == 1)) {
                      pcVar10 = strndup(val_name,(long)local_b4);
                      if (pcVar10 == (char *)0x0) {
                        ly_log(_mod_name_len,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                               "lyd_new_path");
                        goto LAB_001690d5;
                      }
                      pcVar16 = local_60 + uVar4;
                      goto LAB_00168a9a;
                    }
                  }
LAB_001690a9:
                  ly_vlog(_mod_name_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar15,pcVar10);
                  goto LAB_001690d5;
                }
                pcVar10 = (char *)0x0;
                pcVar16 = local_60;
LAB_00168a9a:
                if (*pcVar16 == '\0') {
                  if (((local_4c & 0x20) == 0) || (iVar5 = 1, node->nodetype != LYS_LEAF)) {
                    iVar5 = 0;
                  }
                  plVar9 = local_88;
                  if (local_34 == 0) {
                    plVar9 = (lyd_node *)0x0;
                  }
                  val_str = pcVar10;
                  if (pcVar10 == (char *)0x0) {
                    val_str = local_90;
                  }
                  local_60 = pcVar16;
                  plVar9 = _lyd_new_leaf(plVar9,node,val_str,local_94,iVar5);
                  free(pcVar10);
                  goto LAB_00168af5;
                }
                ly_vlog(_mod_name_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0);
LAB_00169080:
                free(pcVar10);
LAB_001690d5:
                lyd_free_internal_r(local_58,1);
                return (lyd_node *)0x0;
              }
              if ((int)LVar2 < 0x100) {
                if (LVar2 != LYS_ANYXML) {
                  if (LVar2 != LYS_NOTIF) goto LAB_00168975;
                  goto LAB_00168937;
                }
LAB_00168a3c:
                uVar15 = (ulong)(uint)(int)*local_60;
                pcVar10 = local_60;
                if ((int)*local_60 != 0) goto LAB_001690a9;
                if (local_90 == (char *)0x0 && local_7c < LYD_ANYDATA_JSON) {
                  local_90 = "";
                  local_7c = LYD_ANYDATA_CONSTSTRING;
                }
                plVar9 = local_88;
                if (local_34 == 0) {
                  plVar9 = (lyd_node *)0x0;
                }
                plVar9 = lyd_create_anydata(plVar9,node,local_90,local_7c);
              }
              else {
                if (LVar2 != LYS_RPC) {
                  if (LVar2 == LYS_ANYDATA) goto LAB_00168a3c;
                  if (LVar2 != LYS_ACTION) goto LAB_00168975;
                }
LAB_00168937:
                if ((local_4c & 2) != 0) {
                  pcVar10 = strndup(mod_name,(size_t)(_has_predicate +
                                                     ((long)local_44 - (long)mod_name)));
                  ly_vlog(_mod_name_len,LYE_PATH_MISSPAR,LY_VLOG_STR,pcVar10);
                  goto LAB_00169080;
                }
                plVar9 = local_88;
                if (local_34 == 0) {
                  plVar9 = (lyd_node *)0x0;
                }
                plVar9 = _lyd_new(plVar9,node,local_94);
              }
LAB_00168af5:
              if (plVar9 == (lyd_node *)0x0) {
                pcVar10 = strndup(mod_name,(long)local_60 - (long)mod_name);
                if (local_34 == 0) {
                  ly_vlog(_mod_name_len,LYE_SPEC,LY_VLOG_STR,pcVar10,"Failed to create node \"%s\"."
                          ,node->name);
                }
                else {
                  ly_vlog(_mod_name_len,LYE_SPEC,LY_VLOG_STR,pcVar10,
                          "Failed to create node \"%s\" as a child of \"%s\".",node->name,
                          local_88->schema->name);
                }
                free(pcVar10);
                plVar14 = local_58;
                goto LAB_00168e75;
              }
              if (local_34 == 0) {
                plVar14 = _val_name_len;
                if (_val_name_len == (lyd_node *)0x0) {
                  plVar18 = (lyd_node *)0x0;
                }
                else {
                  do {
                    plVar18 = plVar14;
                    plVar14 = plVar18->next;
                  } while (plVar18->next != (lyd_node *)0x0);
                  iVar5 = lyd_insert_nextto(plVar18,plVar9,0,1);
                  plVar14 = local_58;
                  if (iVar5 != 0) goto LAB_00168e75;
                }
                _val_name_len = plVar18;
                local_34 = 1;
              }
              plVar18 = local_58;
              if (((ulong)local_a0 & 1) == 0) {
                plVar8 = plVar9->schema;
                do {
                  plVar8 = lys_parent(plVar8);
                  plVar18 = plVar9;
                  if (plVar8 == (lys_node *)0x0) goto LAB_00168b8d;
                } while (plVar8->nodetype != LVar3);
                iVar5 = lyd_schema_sort(plVar9,0);
                plVar14 = local_58;
                if (iVar5 != 0) goto LAB_00168e75;
              }
LAB_00168b8d:
              plVar14 = plVar18;
              local_38 = 0;
              if (((node->nodetype == LYS_LIST) && (local_80 != 0)) &&
                 (iVar5 = lyd_new_path_list_predicate(plVar9,_has_predicate,local_60,&local_38),
                 iVar5 != 0)) goto LAB_00168e75;
              if (local_60[local_38] == '\0') {
                if ((local_4c & 0x10) != 0) {
                  return plVar9;
                }
                return plVar14;
              }
              pcVar10 = local_60 + local_38;
              local_a8 = lys_node_module(node);
              uVar4 = parse_schema_nodeid(pcVar10,&name,&local_48,(char **)&has_predicate,&local_44,
                                          &local_34,&local_80,(int *)0x0,0);
              if ((int)uVar4 < 1) {
                pcVar16 = pcVar10 + -uVar4;
                uVar4 = (uint)pcVar10[-uVar4];
LAB_00168fd3:
                ly_vlog(_mod_name_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar4,pcVar16)
                ;
                goto LAB_00168e75;
              }
              local_60 = pcVar10 + uVar4;
              if (((node->nodetype == LYS_LIST) && (name == (char *)0x0)) &&
                 (local_88 = (lyd_node *)(ulong)node->padding[2], local_88 != (lyd_node *)0x0)) {
                val = *(char **)&node[1].flags;
                local_c0 = _has_predicate;
                local_58 = (lyd_node *)(long)local_44;
                plVar18 = (lyd_node *)0x0;
                do {
                  local_a0 = (char *)**(undefined8 **)(val + (long)plVar18 * 8);
                  iVar5 = strncmp(local_a0,local_c0,(size_t)local_58);
                  if ((iVar5 == 0) && (local_a0[(long)local_58] == '\0')) {
                    uVar4 = (uint)*local_60;
                    pcVar16 = local_60;
                    if (uVar4 == 0) {
                      return plVar14;
                    }
                    goto LAB_00168fd3;
                  }
                  plVar18 = (lyd_node *)((long)&plVar18->schema + 1);
                } while (local_88 != plVar18);
              }
              uVar11 = 0;
              plVar6 = lys_getnext((lys_node *)0x0,node,module,0);
              local_a0 = (char *)CONCAT71((int7)((ulong)uVar11 >> 8),1);
              plVar8 = node;
            } while (plVar6 != (lys_node *)0x0);
          }
LAB_00168e3b:
          pcVar10 = strndup(mod_name,(size_t)(_has_predicate + ((long)local_44 - (long)mod_name)));
          ly_vlog(_mod_name_len,LYE_PATH_INNODE,LY_VLOG_STR,pcVar10);
          free(pcVar10);
LAB_00168e75:
          lyd_free_internal_r(plVar14,1);
          return (lyd_node *)0x0;
        }
        pcVar10 = strndup(mod_name,(size_t)(name + ((long)local_48 - (long)mod_name)));
        ecode = LYE_PATH_INMOD;
      }
LAB_00168f3a:
      ly_vlog(plVar12,ecode,LY_VLOG_STR,pcVar10);
      free(pcVar10);
      return (lyd_node *)0x0;
    }
    _has_predicate = path + -uVar4;
    cVar1 = path[-uVar4];
  }
  uVar15 = (ulong)(uint)(int)cVar1;
LAB_00168cef:
  ly_vlog(plVar12,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar15,_has_predicate);
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_path(struct lyd_node *data_tree, const struct ly_ctx *ctx, const char *path, void *value,
             LYD_ANYDATA_VALUETYPE value_type, int options)
{
    char *str;
    const char *mod_name, *name, *val_name, *val, *node_mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    struct lyd_node *ret = NULL, *node, *parent = NULL;
    const struct lys_node *schild, *sparent, *tmp;
    const struct lys_node_list *slist;
    const struct lys_module *module, *prev_mod;
    int r, i, parsed = 0, mod_name_len, nam_len, val_name_len, val_len;
    int is_relative = -1, has_predicate, first_iter = 1, edit_leaf;
    int backup_is_relative, backup_mod_name_len, yang_data_name_len;

    if (!path || (!data_tree && !ctx)
            || (!data_tree && (path[0] != '/'))) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = data_tree->schema->module->ctx;
    }

    id = path;

    if (data_tree) {
        if (path[0] == '/') {
            /* absolute path, go through all the siblings and try to find the right parent, if exists,
             * first go through all the next siblings keeping the original order, for positional predicates */
            for (node = data_tree; !parsed && node; node = node->next) {
                parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                          options, &parsed);
            }
            if (!parsed) {
                for (node = data_tree->prev; !parsed && node->next; node = node->prev) {
                    parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                              options, &parsed);
                }
            }
        } else {
            /* relative path, use only the provided data tree root */
            parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, data_tree,
                                                      options, &parsed);
        }
        if (parsed == -1) {
            return NULL;
        }
        if (parsed) {
            assert(parent);
            /* if we parsed something we have a relative path now for sure, otherwise we don't know */
            is_relative = 1;

            id += parsed;

            if (!id[0]) {
                /* the node exists, are we supposed to update it or is it default? */
                if (!(options & LYD_PATH_OPT_UPDATE) && (!parent->dflt || (options & LYD_PATH_OPT_DFLT))) {
                    LOGVAL(ctx, LYE_PATH_EXISTS, LY_VLOG_STR, path);
                    return NULL;
                }

                /* no change, the default node already exists */
                if (parent->dflt && (options & LYD_PATH_OPT_DFLT)) {
                    return NULL;
                }

                return lyd_new_path_update(parent, value, value_type, options & LYD_PATH_OPT_DFLT);
            }
        }
    }

    backup_is_relative = is_relative;
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        /* move to the next node in the path */
        id += r;
    } else {
        is_relative = backup_is_relative;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    /* move to the next node in the path */
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    /* prepare everything for the schema search loop */
    if (is_relative) {
        /* we are relative to data_tree or parent if some part of the path already exists */
        if (!data_tree) {
            LOGERR(ctx, LY_EINVAL, "%s: provided relative path (%s) without context node.", path);
            return NULL;
        } else if (!parent) {
            parent = data_tree;
        }
        sparent = parent->schema;
        module = prev_mod = lys_node_module(sparent);
    } else {
        /* we are starting from scratch, absolute path */
        assert(!parent);
        if (!mod_name) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        module = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

        if (!module) {
            str = strndup(path, (mod_name + mod_name_len) - path);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        mod_name = NULL;
        mod_name_len = 0;
        prev_mod = module;

        sparent = NULL;
        if (yang_data_name) {
            sparent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!sparent) {
                str = strndup(path, (yang_data_name + yang_data_name_len) - path);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }
    }

    /* create nodes in a loop */
    while (1) {
        /* find the schema node */
        schild = NULL;
        while ((schild = lys_getnext(schild, sparent, module, 0))) {
            if (schild->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST
                                    | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                /* module comparison */
                if (mod_name) {
                    node_mod_name = lys_node_module(schild)->name;
                    if (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                        continue;
                    }
                } else if (lys_node_module(schild) != prev_mod) {
                    continue;
                }

                /* name check */
                if (strncmp(schild->name, name, nam_len) || schild->name[nam_len]) {
                    continue;
                }

                /* RPC/action in/out check */
                for (tmp = lys_parent(schild); tmp && (tmp->nodetype == LYS_USES); tmp = lys_parent(tmp));
                if (tmp) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (tmp->nodetype == LYS_INPUT) {
                            continue;
                        }
                    } else {
                        if (tmp->nodetype == LYS_OUTPUT) {
                            continue;
                        }
                    }
                }

                break;
            }
        }

        if (!schild) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            lyd_free(ret);
            return NULL;
        }

        /* we have the right schema node */
        switch (schild->nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            if (options & LYD_PATH_OPT_NOPARENT) {
                /* these were supposed to exist */
                str = strndup(path, (name + nam_len) - path);
                LOGVAL(ctx, LYE_PATH_MISSPAR, LY_VLOG_STR, str);
                free(str);
                lyd_free(ret);
                return NULL;
            }
            node = _lyd_new(is_relative ? parent : NULL, schild, (options & LYD_PATH_OPT_DFLT) ? 1 : 0);
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            str = NULL;
            if (has_predicate) {
                if ((r = parse_schema_json_predicate(id, NULL, NULL, &val_name, &val_name_len, &val, &val_len, &has_predicate)) < 1) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                    lyd_free(ret);
                    return NULL;
                }
                id += r;

                if ((val_name[0] != '.') || (val_name_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, val_name[0], val_name);
                    lyd_free(ret);
                    return NULL;
                }

                str = strndup(val, val_len);
                if (!str) {
                    LOGMEM(ctx);
                    lyd_free(ret);
                    return NULL;
                }
            }
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                free(str);
                lyd_free(ret);
                return NULL;
            }

            if ((options & LYD_PATH_OPT_EDIT) && schild->nodetype == LYS_LEAF) {
                edit_leaf = 1;
            } else {
                edit_leaf = 0;
            }
            node = _lyd_new_leaf(is_relative ? parent : NULL, schild, (str ? str : value),
                                 (options & LYD_PATH_OPT_DFLT) ? 1 : 0, edit_leaf);
            free(str);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                lyd_free(ret);
                return NULL;
            }
            if (value_type <= LYD_ANYDATA_STRING && !value) {
                value_type = LYD_ANYDATA_CONSTSTRING;
                value = "";
            }
            node = lyd_create_anydata(is_relative ? parent : NULL, schild, value, value_type);
            break;
        default:
            LOGINT(ctx);
            node = NULL;
            break;
        }

        if (!node) {
            str = strndup(path, id - path);
            if (is_relative) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\" as a child of \"%s\".",
                       schild->name, parent->schema->name);
            } else {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\".", schild->name);
            }
            free(str);
            lyd_free(ret);
            return NULL;
        }
        /* special case when we are creating a sibling of a top-level data node */
        if (!is_relative) {
            if (data_tree) {
                for (; data_tree->next; data_tree = data_tree->next);
                if (lyd_insert_after(data_tree, node)) {
                    lyd_free(ret);
                    return NULL;
                }
            }
            is_relative = 1;
        }

        if (first_iter) {
            /* sort if needed, but only when inserted somewhere */
            sparent = node->schema;
            do {
                sparent = lys_parent(sparent);
            } while (sparent && (sparent->nodetype != ((options & LYD_PATH_OPT_OUTPUT) ? LYS_OUTPUT : LYS_INPUT)));
            if (sparent && lyd_schema_sort(node, 0)) {
                lyd_free(ret);
                return NULL;
            }

            /* set first created node */
            ret = node;
            first_iter = 0;
        }

        parsed = 0;
        if ((schild->nodetype == LYS_LIST) && has_predicate && lyd_new_path_list_predicate(node, name, id, &parsed)) {
            lyd_free(ret);
            return NULL;
        }
        id += parsed;

        if (!id[0]) {
            /* we are done */
            if (options & LYD_PATH_OPT_NOPARENTRET) {
                /* last created node */
                return node;
            }
            return ret;
        }

        /* prepare for another iteration */
        parent = node;
        sparent = schild;
        prev_mod = lys_node_module(schild);

        /* parse another node */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            lyd_free(ret);
            return NULL;
        }
        id += r;

        /* if a key of a list was supposed to be created, it is created as a part of the list instance creation */
        if ((schild->nodetype == LYS_LIST) && !mod_name) {
            slist = (const struct lys_node_list *)schild;
            for (i = 0; i < slist->keys_size; ++i) {
                if (!strncmp(slist->keys[i]->name, name, nam_len) && !slist->keys[i]->name[nam_len]) {
                    /* the path continues? there cannot be anything after a key (leaf) */
                    if (id[0]) {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        lyd_free(ret);
                        return NULL;
                    }
                    return ret;
                }
            }
        }
    }

    LOGINT(ctx);
    return NULL;
}